

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O1

void __thiscall
Clasp::mt::SharedLitsClause::destroy(SharedLitsClause *this,Solver *s,bool detachFirst)

{
  SharedLiterals *pSVar1;
  uint64 uVar2;
  Chunk *b;
  
  if (s != (Solver *)0x0) {
    if (detachFirst) {
      ClauseHead::detach(&this->super_ClauseHead,s);
    }
    if (((this->super_ClauseHead).info_.super_ConstraintScore.rep & 0x30000000) != 0) {
      uVar2 = 0;
      if (0x1f < s->memUse_) {
        uVar2 = s->memUse_ - 0x20;
      }
      s->memUse_ = uVar2;
    }
    pSVar1 = (this->super_ClauseHead).field_0.shared_;
    LOCK();
    (pSVar1->refCount_).super___atomic_base<int>._M_i =
         (pSVar1->refCount_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar1->refCount_).super___atomic_base<int>._M_i == 0) {
      operator_delete(pSVar1);
    }
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x10])(this);
    (this->super_ClauseHead).super_Constraint._vptr_Constraint =
         (_func_int **)(s->smallAlloc_).freeList_;
    (s->smallAlloc_).freeList_ = (Chunk *)this;
    return;
  }
  pSVar1 = (this->super_ClauseHead).field_0.shared_;
  LOCK();
  (pSVar1->refCount_).super___atomic_base<int>._M_i =
       (pSVar1->refCount_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pSVar1->refCount_).super___atomic_base<int>._M_i == 0) {
    operator_delete(pSVar1);
  }
  (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x10])(this);
  return;
}

Assistant:

void SharedLitsClause::destroy(Solver* s, bool detachFirst) {
	if (s) {
		if (detachFirst) { ClauseHead::detach(*s); }
		if (learnt())    { s->freeLearntBytes(32); }
	}
	shared_->release();
	void* mem = this;
	this->~SharedLitsClause();
	if (s) { s->freeSmall(mem); }
}